

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idle.c
# Opt level: O2

int run_test_idle_starvation(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_idle_init(puVar2,&idle_handle);
  if (iVar1 == 0) {
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_check_init(puVar2,&check_handle);
      if (iVar1 == 0) {
        iVar1 = uv_check_start(&check_handle,check_cb);
        if (iVar1 == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_timer_init(puVar2,&timer_handle);
          if (iVar1 == 0) {
            iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
            if (iVar1 == 0) {
              puVar2 = uv_default_loop();
              iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
              if (iVar1 == 0) {
                if (idle_cb_called < 1) {
                  pcVar3 = "idle_cb_called > 0";
                  uStack_10 = 0x5d;
                }
                else if (timer_cb_called == 1) {
                  if (close_cb_called == 3) {
                    puVar2 = uv_default_loop();
                    uv_walk(puVar2,close_walk_cb,(void *)0x0);
                    uv_run(puVar2,UV_RUN_DEFAULT);
                    puVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(puVar2);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                    uStack_10 = 0x61;
                  }
                  else {
                    pcVar3 = "close_cb_called == 3";
                    uStack_10 = 0x5f;
                  }
                }
                else {
                  pcVar3 = "timer_cb_called == 1";
                  uStack_10 = 0x5e;
                }
              }
              else {
                pcVar3 = "r == 0";
                uStack_10 = 0x5b;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_10 = 0x58;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_10 = 0x56;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_10 = 0x53;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_10 = 0x51;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_10 = 0x4e;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_10 = 0x4c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idle.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(idle_starvation) {
  int r;

  r = uv_idle_init(uv_default_loop(), &idle_handle);
  ASSERT(r == 0);
  r = uv_idle_start(&idle_handle, idle_cb);
  ASSERT(r == 0);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT(r == 0);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT(r == 0);

  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT(r == 0);
  r = uv_timer_start(&timer_handle, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(idle_cb_called > 0);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}